

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap-internal.h
# Opt level: O0

int min_heap_reserve_(min_heap_t *s,uint n)

{
  event **ppeVar1;
  uint local_30;
  uint local_2c;
  uint a;
  event **p;
  uint n_local;
  min_heap_t *s_local;
  
  if (s->a < n) {
    if (s->a == 0) {
      local_30 = 8;
    }
    else {
      local_30 = s->a << 1;
    }
    local_2c = local_30;
    if (local_30 < n) {
      local_2c = n;
    }
    ppeVar1 = (event **)event_mm_realloc_(s->p,(ulong)local_2c << 3);
    if (ppeVar1 == (event **)0x0) {
      return -1;
    }
    s->p = ppeVar1;
    s->a = local_2c;
  }
  return 0;
}

Assistant:

int min_heap_reserve_(min_heap_t* s, unsigned n)
{
	if (s->a < n)
	{
		struct event** p;
		unsigned a = s->a ? s->a * 2 : 8;
		if (a < n)
			a = n;
#if (SIZE_MAX == UINT32_MAX)
		if (a > SIZE_MAX / sizeof *p)
			return -1;
#endif
		if (!(p = (struct event**)mm_realloc(s->p, a * sizeof *p)))
			return -1;
		s->p = p;
		s->a = a;
	}
	return 0;
}